

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
int_writer<unsigned_long_long,duckdb_fmt::v6::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  anon_class_40_4_2c7d0318 add_thousands_sep;
  char *pcVar1;
  int digit_index;
  const_iterator group;
  int local_3c;
  num_writer *local_38;
  num_writer *pnStack_30;
  undefined8 local_28;
  undefined8 *puStack_20;
  int *local_18;
  undefined8 local_10;
  
  pnStack_30 = this + 0x18;
  local_18 = &local_3c;
  local_3c = 0;
  local_10 = **(undefined8 **)(this + 0x10);
  puStack_20 = &local_10;
  local_28 = 1;
  add_thousands_sep.s.data_ = (char *)pnStack_30;
  add_thousands_sep.this = (num_writer *)this;
  add_thousands_sep.s.size_ = 1;
  add_thousands_sep.group = (const_iterator *)puStack_20;
  add_thousands_sep.digit_index = local_18;
  local_38 = this;
  pcVar1 = internal::operator()(*it,*(unsigned_long *)this,*(int *)(this + 8),add_thousands_sep);
  *it = pcVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
        basic_string_view<char_type> s(&sep, sep_size);
        // Index of a decimal digit with the least significant digit having
        // index 0.
        int digit_index = 0;
        std::string::const_iterator group = groups.cbegin();
        it = format_decimal<char_type>(
            it, abs_value, size,
            [this, s, &group, &digit_index](char_type*& buffer) {
              if (*group <= 0 || ++digit_index % *group != 0 ||
                  *group == max_value<char>())
                return;
              if (group + 1 != groups.cend()) {
                digit_index = 0;
                ++group;
              }
              buffer -= s.size();
              std::uninitialized_copy(s.data(), s.data() + s.size(),
                                      make_checked(buffer, s.size()));
            });
      }